

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::LineSegmentsISA::vbounds
          (BBox3fa *__return_storage_ptr__,LineSegmentsISA *this,LinearSpace3fa *space,size_t i)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pcVar6 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
  uVar5 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_LineSegments).field_0x68);
  sVar7 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
  lVar13 = uVar5 * sVar7;
  lVar14 = (uVar5 + 1) * sVar7;
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  aVar4 = (space->vz).field_0;
  uVar1 = *(undefined4 *)(pcVar6 + lVar13 + 8);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15 = vmulps_avx512vl((undefined1  [16])aVar4,auVar15);
  uVar1 = *(undefined4 *)(pcVar6 + lVar13 + 4);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar15 = vfmadd231ps_avx512vl(auVar15,(undefined1  [16])aVar3,auVar16);
  uVar1 = *(undefined4 *)(pcVar6 + lVar13);
  auVar8._4_4_ = uVar1;
  auVar8._0_4_ = uVar1;
  auVar8._8_4_ = uVar1;
  auVar8._12_4_ = uVar1;
  auVar15 = vfmadd231ps_avx512vl(auVar15,(undefined1  [16])aVar2,auVar8);
  uVar1 = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(pcVar6 + lVar14 + 8);
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar16 = vmulps_avx512vl((undefined1  [16])aVar4,auVar10);
  uVar1 = *(undefined4 *)(pcVar6 + lVar14 + 4);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar16 = vfmadd231ps_avx512vl(auVar16,(undefined1  [16])aVar3,auVar11);
  auVar15 = vblendps_avx(auVar15,auVar19,8);
  uVar1 = *(undefined4 *)(pcVar6 + lVar14);
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar16 = vfmadd231ps_avx512vl(auVar16,(undefined1  [16])aVar2,auVar12);
  uVar1 = *(undefined4 *)(pcVar6 + lVar14 + 0xc);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar16 = vblendps_avx(auVar16,auVar17,8);
  auVar8 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vmaxss_avx(auVar17,auVar19);
  fVar9 = auVar16._0_4_ * (this->super_LineSegments).maxRadiusScale;
  auVar18._4_4_ = fVar9;
  auVar18._0_4_ = fVar9;
  auVar18._8_4_ = fVar9;
  auVar18._12_4_ = fVar9;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar8,auVar18);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar15._0_4_ + fVar9;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar15._4_4_ + fVar9;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar15._8_4_ + fVar9;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar15._12_4_ + fVar9;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }